

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O0

PolyNf * Inferences::simplifyPoly<Kernel::NumTraits<Kernel::RationalConstantType>>
                   (Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in,
                   PolyNf *simplifiedArgs,bool removeZeros)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  *t;
  byte in_CL;
  PolyNf *in_RDI;
  bool in_stack_000000df;
  PolyNf *in_stack_000000e0;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_000000e8;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> fac;
  StlIter __end0;
  StlIter __begin0;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  *__range5;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  poly;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> simpl;
  Monom monom;
  uint i;
  int offs;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> sum;
  RationalConstantType *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  uint in_stack_fffffffffffffd64;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_fffffffffffffd68;
  Elem in_stack_fffffffffffffd70;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_fffffffffffffd90;
  RationalConstantType *in_stack_fffffffffffffda0;
  RationalConstantType *in_stack_fffffffffffffda8;
  bool local_24d;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_218 [7];
  undefined1 local_128 [32];
  undefined1 *local_108;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_e8;
  byte local_d1;
  OptionBase<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
  local_d0 [2];
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_98 [3];
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_68 [2];
  uint local_48;
  int local_44;
  undefined1 in_stack_ffffffffffffffd7;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_stack_ffffffffffffffd8
  ;
  
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
            ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
             in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
  local_44 = 0;
  for (local_48 = 0; uVar3 = local_48,
      uVar2 = Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::nSummands
                        ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x81e29c),
      uVar3 < uVar2; local_48 = local_48 + 1) {
    Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::summandAt
              ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (uint)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    simplifyMonom<Kernel::NumTraits<Kernel::RationalConstantType>>
              (in_stack_000000e8,in_stack_000000e0,in_stack_000000df);
    bVar1 = Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::isZeroMul
                      (in_stack_fffffffffffffd90);
    if ((!bVar1) || ((in_CL & 1) == 0)) {
      local_d1 = 0;
      Lib::
      Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
      ::operator->(local_98);
      uVar3 = Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::nFactors
                        ((MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x81e3b8)
      ;
      local_24d = false;
      if (uVar3 == 1) {
        in_stack_fffffffffffffda8 =
             (RationalConstantType *)
             Lib::
             Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
             ::operator->(local_98);
        in_stack_fffffffffffffda0 =
             (RationalConstantType *)
             Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::factorAt
                       ((MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                        CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                        (uint)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>::tryPolynom
                  ((MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                   in_stack_fffffffffffffd68);
        local_d1 = 1;
        local_24d = Lib::
                    OptionBase<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
                    ::isSome(local_d0);
      }
      if ((local_d1 & 1) != 0) {
        Lib::
        Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
        ::~Option((Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
                   *)0x81e442);
      }
      if (local_24d == false) {
        Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
                  (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::push
                  ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
                   in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Monom
                  ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x81e6dc);
      }
      else {
        in_stack_fffffffffffffd90 =
             (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             Lib::
             Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
             ::operator->(local_98);
        Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::factorAt
                  ((MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                   (uint)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>::tryPolynom
                  ((MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                   in_stack_fffffffffffffd68);
        t = Lib::
            OptionBase<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
            ::unwrap((OptionBase<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
                      *)0x81e497);
        Lib::
        Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
        ::Perfect(&local_e8,t);
        Lib::
        Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
        ::~Option((Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
                   *)0x81e4bf);
        Lib::
        Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
        ::operator->(&local_e8);
        Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::iterSummands
                  ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        local_108 = local_128;
        Lib::
        IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
        ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
                 *)in_stack_fffffffffffffd58);
        Lib::
        IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
        ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
               *)in_stack_fffffffffffffd58);
        while (bVar1 = Lib::operator!=((StlIter *)
                                       CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60)
                                       ,(StlIter *)in_stack_fffffffffffffd58), bVar1) {
          in_stack_fffffffffffffd70 =
               Lib::
               IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
               ::StlIter::operator*((StlIter *)0x81e553);
          Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
                    (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
          Kernel::RationalConstantType::operator*
                    (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
          Kernel::RationalConstantType::operator=
                    ((RationalConstantType *)
                     CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     in_stack_fffffffffffffd58);
          Kernel::RationalConstantType::~RationalConstantType
                    ((RationalConstantType *)
                     CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
                    (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
          Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::push
                    ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
                     in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
          Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Monom
                    ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x81e5ec);
          Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Monom
                    ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x81e5f9);
          Lib::
          IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
          ::StlIter::operator++
                    ((StlIter *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        }
      }
    }
    in_stack_fffffffffffffd68 =
         (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
         Lib::
         Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
         ::operator->(local_68);
    in_stack_fffffffffffffd64 =
         Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::nFactors
                   ((MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x81e721);
    local_44 = in_stack_fffffffffffffd64 + local_44;
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x81e746);
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x81e753);
  }
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
            ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),local_218);
  PolynomialEvaluation::simplifySummation<Kernel::NumTraits<Kernel::RationalConstantType>>
            (in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
            ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
            ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  return in_RDI;
}

Assistant:

PolyNf simplifyPoly(Polynom<Number> const& in, PolyNf* simplifiedArgs, bool removeZeros)
{
  using Monom   = Monom<Number>;


  // first we simplify all the monoms containted in this polynom
  Stack<Monom> sum;
  {
    auto offs = 0;
    for (unsigned i = 0; i < in.nSummands(); i++) {
      auto monom  = in.summandAt(i);
      auto simpl = simplifyMonom(monom, &simplifiedArgs[offs], removeZeros);

      if (simpl.isZeroMul() && removeZeros) {
        /* we don't add it */
      } else if (simpl.factors->nFactors() == 1 && simpl.factors->factorAt(0).tryPolynom().isSome()) {
        /* k * (t1 + ... tn) ==> k * t1 + ... k * tn */
        auto poly = simpl.factors->factorAt(0).tryPolynom().unwrap();
        for (auto fac : poly->iterSummands()) {
          fac.numeral = fac.numeral * simpl.numeral;
          ASS(!removeZeros || fac.numeral != Number::constant(0))
          sum.push(fac);
        }
      } else {
        sum.push(simpl);
      }
      offs += monom.factors->nFactors();
    }
  }

  return PolynomialEvaluation::simplifySummation(std::move(sum), removeZeros);
}